

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_DynamicLib.cpp
# Opt level: O0

bool __thiscall axl::sys::psx::DynamicLib::getInfo(DynamicLib *this,int request,void *p)

{
  int iVar1;
  ErrorRef *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  bool bVar2;
  int result;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar1 = dlinfo(*in_RDI,in_ESI,in_RDX);
  bVar2 = iVar1 != -1;
  if (!bVar2) {
    dlerror();
    err::ErrorRef::ErrorRef(in_RDX,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    err::setError((ErrorRef *)0x143d82);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x143d8e);
  }
  return bVar2;
}

Assistant:

bool
DynamicLib::getInfo(
	int request,
	void* p
) {
	int result = ::dlinfo(m_h, request, p);
	if (result == -1) {
		err::setError(::dlerror());
		return false;
	}

	return true;
}